

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ImVector<unsigned_short> *this_00;
  ImDrawList *pIVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  unsigned_short *puVar4;
  ImDrawVert *pIVar5;
  ImDrawVert *pIVar6;
  long lVar7;
  int j;
  int iVar8;
  ImVector<ImDrawVert> local_58;
  ImDrawData *local_40;
  long local_38;
  
  local_58.Size = 0;
  local_58.Capacity = 0;
  local_58.Data = (ImDrawVert *)0x0;
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  local_40 = this;
  for (lVar7 = 0; lVar7 < this->CmdListsCount; lVar7 = lVar7 + 1) {
    pIVar1 = this->CmdLists[lVar7];
    iVar8 = (pIVar1->IdxBuffer).Size;
    if (iVar8 != 0) {
      local_38 = lVar7;
      ImVector<ImDrawVert>::resize(&local_58,iVar8);
      this_00 = &pIVar1->IdxBuffer;
      for (iVar8 = 0; iVar8 < this_00->Size; iVar8 = iVar8 + 1) {
        puVar4 = ImVector<unsigned_short>::operator[](this_00,iVar8);
        pIVar5 = ImVector<ImDrawVert>::operator[](&pIVar1->VtxBuffer,(uint)*puVar4);
        pIVar6 = ImVector<ImDrawVert>::operator[](&local_58,iVar8);
        IVar3 = pIVar5->uv;
        pIVar6->pos = pIVar5->pos;
        pIVar6->uv = IVar3;
        pIVar6->col = pIVar5->col;
      }
      uVar2._0_4_ = (pIVar1->VtxBuffer).Size;
      uVar2._4_4_ = (pIVar1->VtxBuffer).Capacity;
      (pIVar1->VtxBuffer).Size = local_58.Size;
      (pIVar1->VtxBuffer).Capacity = local_58.Capacity;
      pIVar5 = (pIVar1->VtxBuffer).Data;
      (pIVar1->VtxBuffer).Data = local_58.Data;
      local_58._0_8_ = uVar2;
      local_58.Data = pIVar5;
      ImVector<unsigned_short>::resize(this_00,0);
      local_40->TotalVtxCount = local_40->TotalVtxCount + (pIVar1->VtxBuffer).Size;
      lVar7 = local_38;
      this = local_40;
    }
  }
  ImVector<ImDrawVert>::~ImVector(&local_58);
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}